

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_lazy_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint8_t uVar4;
  roaring_array_t *prVar5;
  uint uVar6;
  roaring_bitmap_t *prVar7;
  container_t *pcVar8;
  int *c;
  int *piVar9;
  uint8_t uVar10;
  uint end_index;
  ulong uVar11;
  uint16_t uVar12;
  ulong uVar13;
  roaring_array_t *prVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_8d;
  uint8_t local_8c;
  uint8_t local_8b;
  uint16_t local_8a;
  ulong local_88;
  ulong local_80;
  roaring_array_t *local_78;
  ulong local_70;
  roaring_array_t *local_68;
  ulong local_60;
  roaring_array_t *local_58;
  int *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_8b = '\0';
  uVar17 = (x1->high_low_container).size;
  prVar7 = x2;
  if (uVar17 != 0) {
    uVar6 = (x2->high_low_container).size;
    local_70 = (ulong)uVar6;
    prVar7 = x1;
    if (uVar6 != 0) {
      local_68 = &roaring_bitmap_create_with_capacity(uVar6 + uVar17)->high_low_container;
      if ((((x1->high_low_container).flags & 1) == 0) || (((x2->high_low_container).flags & 1) == 0)
         ) {
        local_68->flags = local_68->flags & 0xfe;
      }
      else {
        local_68->flags = local_68->flags | 1;
      }
      uVar12 = *(x1->high_low_container).keys;
      local_8a = *(x2->high_low_container).keys;
      local_60 = (ulong)-uVar17;
      local_80 = 0;
      uVar13 = 0;
      local_58 = &x2->high_low_container;
      local_48 = (ulong)uVar17;
LAB_00115def:
      do {
        local_88 = uVar13 & 0xffffffff;
        local_78 = (roaring_array_t *)(ulong)(uint)((int)local_60 + (int)uVar13);
        local_50 = (int *)(long)(int)uVar13;
        local_38 = (long)local_50 * 8;
        lVar16 = 0;
        local_40 = uVar13;
        while( true ) {
          prVar14 = local_58;
          uVar13 = local_88 + lVar16;
          iVar15 = (int)lVar16;
          uVar17 = (uint)local_80;
          if (uVar12 == local_8a) break;
          if (local_8a <= uVar12) {
            local_8d = local_58->typecodes[local_80 & 0xffff];
            pcVar8 = get_copy_of_container
                               (local_58->containers[local_80 & 0xffff],&local_8d,
                                (_Bool)(local_58->flags & 1));
            prVar5 = local_68;
            uVar10 = local_8d;
            if ((prVar14->flags & 1) != 0) {
              if (((roaring_array_t *)&prVar14->size)->size <= (int)uVar17) goto LAB_00116233;
              prVar14->containers[(int)uVar17] = pcVar8;
              prVar14->typecodes[(int)uVar17] = local_8d;
            }
            local_78 = &x1->high_low_container;
            extend_array(local_68,1);
            iVar2 = prVar5->size;
            prVar5->keys[iVar2] = local_8a;
            prVar5->containers[iVar2] = pcVar8;
            prVar5->typecodes[iVar2] = uVar10;
            prVar5->size = prVar5->size + 1;
            uVar17 = (int)local_80 + 1;
            if (uVar17 != (uint)local_70) {
              local_8a = prVar14->keys[(ulong)uVar17 & 0xffff];
            }
            x1 = (roaring_bitmap_t *)local_78;
            if (uVar17 == (uint)local_70) {
              uVar6 = iVar15 + (int)local_88;
              goto LAB_001161bf;
            }
            uVar13 = (ulong)(uint)((int)local_88 + iVar15);
            local_80 = (ulong)uVar17;
            goto LAB_00115def;
          }
          uVar11 = uVar13 & 0xffff;
          local_8c = (x1->high_low_container).typecodes[uVar11];
          pcVar8 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar11],&local_8c,
                              (_Bool)((x1->high_low_container).flags & 1));
          prVar14 = local_68;
          uVar10 = local_8c;
          if (((x1->high_low_container).flags & 1) != 0) {
            if ((x1->high_low_container).size <= (int)uVar13) {
LAB_00116233:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            *(container_t **)((long)(x1->high_low_container).containers + lVar16 * 8 + local_38) =
                 pcVar8;
            ((x1->high_low_container).typecodes + (long)local_50)[lVar16] = local_8c;
          }
          extend_array(local_68,1);
          iVar2 = prVar14->size;
          prVar14->keys[iVar2] = uVar12;
          prVar14->containers[iVar2] = pcVar8;
          prVar14->typecodes[iVar2] = uVar10;
          prVar14->size = prVar14->size + 1;
          if ((int)local_78 + iVar15 != -1) {
            uVar12 = (x1->high_low_container).keys[(ushort)((short)local_88 + (short)lVar16 + 1)];
          }
          lVar16 = lVar16 + 1;
          if ((int)lVar16 + (int)local_78 == 0) {
            uVar6 = (int)local_40 + (int)lVar16;
            uVar17 = (uint)local_80;
            prVar14 = local_58;
            goto LAB_001161bf;
          }
        }
        local_78 = (roaring_array_t *)CONCAT62(local_78._2_6_,uVar12);
        uVar6 = (int)local_88 + iVar15 & 0xffff;
        local_8c = (x1->high_low_container).typecodes[uVar6];
        local_8d = local_58->typecodes[uVar17 & 0xffff];
        c = (int *)container_lazy_xor((x1->high_low_container).containers[uVar6],local_8c,
                                      local_58->containers[uVar17 & 0xffff],local_8d,&local_8b);
        prVar5 = local_68;
        uVar4 = local_8b;
        piVar9 = c;
        uVar10 = local_8b;
        if (local_8b == '\x04') {
          uVar10 = (uint8_t)c[2];
          if (uVar10 == '\x04') {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          piVar9 = *(int **)c;
        }
        if ((uVar10 == '\x03') || (uVar10 == '\x02')) {
          bVar18 = 0 < *piVar9;
        }
        else {
          if (uVar10 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (*piVar9 == -1) {
            if (**(long **)(piVar9 + 2) == 0) {
              uVar13 = 0xffffffffffffffff;
              do {
                if (uVar13 == 0x3fe) {
                  uVar11 = 0x3ff;
                  break;
                }
                uVar11 = uVar13 + 1;
                lVar3 = uVar13 + 2;
                uVar13 = uVar11;
              } while ((*(long **)(piVar9 + 2))[lVar3] == 0);
              bVar18 = 0x3fe < uVar11;
            }
            else {
              bVar18 = false;
            }
          }
          else {
            bVar18 = *piVar9 == 0;
          }
          bVar18 = (bool)(bVar18 ^ 1);
        }
        if (bVar18) {
          local_50 = c;
          extend_array(local_68,1);
          iVar2 = prVar5->size;
          prVar5->keys[iVar2] = (uint16_t)local_78;
          prVar5->containers[iVar2] = local_50;
          prVar5->typecodes[iVar2] = uVar4;
          prVar5->size = prVar5->size + 1;
        }
        else {
          container_free(c,local_8b);
        }
        uVar13 = local_88 + lVar16 + 1;
        uVar17 = uVar17 + 1;
        if (uVar17 == (uint)local_70 || (int)local_60 + (int)local_88 + iVar15 == -1) {
          uVar6 = iVar15 + (int)local_88 + 1;
LAB_001161bf:
          prVar5 = local_68;
          if (uVar6 == (uint)local_48) {
            bVar1 = prVar14->flags;
            x1 = (roaring_bitmap_t *)prVar14;
            end_index = (uint)local_70;
            uVar6 = uVar17;
          }
          else {
            if (uVar17 != (uint)local_70) {
              return (roaring_bitmap_t *)local_68;
            }
            bVar1 = (x1->high_low_container).flags;
            end_index = (uint)local_48;
          }
          ra_append_copy_range(local_68,&x1->high_low_container,uVar6,end_index,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)prVar5;
        }
        uVar12 = (x1->high_low_container).keys[(uint)uVar13 & 0xffff];
        local_8a = prVar14->keys[uVar17 & 0xffff];
        local_80 = (ulong)uVar17;
      } while( true );
    }
  }
  prVar7 = roaring_bitmap_copy(prVar7);
  return prVar7;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_xor(const roaring_bitmap_t *x1,
                                          const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_lazy_xor(
                                    c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}